

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::LoadStoreMachine::GenStoreShader<tcu::Vector<unsigned_int,4>>
          (string *__return_storage_ptr__,LoadStoreMachine *this,int stage,GLenum internalformat,
          Vector<unsigned_int,_4> *write_value)

{
  ostream *poVar1;
  undefined4 in_register_0000000c;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  char *pcVar2;
  ostringstream os;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  if ((int)this == 4) {
    std::operator<<(&local_1a0,"\n#define KSIZE 100\nlayout(local_size_x = KSIZE) in;");
  }
  poVar1 = std::operator<<(&local_1a0,"\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1c0,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  pcVar2 = ", binding = 1) writeonly uniform ";
  poVar1 = std::operator<<(poVar1,", binding = 1) writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_1e0,(ShaderImageLoadStoreBase *)pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_200,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  pcVar2 = ", binding = 2) writeonly uniform ";
  poVar1 = std::operator<<(poVar1,", binding = 2) writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_220,(ShaderImageLoadStoreBase *)pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_240,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  pcVar2 = ", binding = 0) writeonly uniform ";
  poVar1 = std::operator<<(poVar1,", binding = 0) writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_260,(ShaderImageLoadStoreBase *)pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_280,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  pcVar2 = ", binding = 3) writeonly uniform ";
  poVar1 = std::operator<<(poVar1,", binding = 3) writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_2a0,(ShaderImageLoadStoreBase *)pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  pcVar2 = 
  "image2DArray g_image_2darray;\nlayout(std430) buffer out_data {\n  ivec4 o_color;\n};\nvoid main() {\n  "
  ;
  poVar1 = std::operator<<(poVar1,
                           "image2DArray g_image_2darray;\nlayout(std430) buffer out_data {\n  ivec4 o_color;\n};\nvoid main() {\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_2c0,(ShaderImageLoadStoreBase *)pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c0);
  pcVar2 = "vec4 g_value = ";
  poVar1 = std::operator<<(poVar1,"vec4 g_value = ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_2e0,(ShaderImageLoadStoreBase *)pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_2e0);
  pcVar2 = "vec4(o_color) + ";
  poVar1 = std::operator<<(poVar1,"vec4(o_color) + ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_300,(ShaderImageLoadStoreBase *)pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_300);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)
                                  CONCAT44(in_register_0000000c,internalformat));
  std::operator<<(poVar1,
                  ";\n  int g_index[6] = int[](o_color.x, o_color.y, o_color.z, o_color.w, o_color.r, o_color.g);"
                 );
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (((ulong)this & 0xfffffffb) == 0) {
    pcVar2 = "\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
    if ((int)this == 0) {
      pcVar2 = "\n  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
    }
    std::operator<<(&local_1a0,pcVar2);
  }
  std::operator<<(&local_1a0,
                  "\n  imageStore(g_image_2d, coord, g_value);\n  imageStore(g_image_3d, ivec3(coord.xy, g_index[0]), g_value);\n  imageStore(g_image_3d, ivec3(coord.xy, g_index[1]), g_value);\n  for (int i = 0; i < 6; ++i) {\n    imageStore(g_image_cube, ivec3(coord, g_index[i]), g_value);\n  }\n  imageStore(g_image_2darray, ivec3(coord, g_index[0]), g_value);\n  imageStore(g_image_2darray, ivec3(coord, g_index[1]), g_value);\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenStoreShader(int stage, GLenum internalformat, const T& write_value)
	{
		std::ostringstream os;
		if (stage == 4)
		{ // CS
			os << NL "#define KSIZE 100" NL "layout(local_size_x = KSIZE) in;";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 1) writeonly uniform "
		   << TypePrefix<T>() << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ", binding = 2) writeonly uniform " << TypePrefix<T>() << "image3D g_image_3d;" NL "layout("
		   << FormatEnumToString(internalformat) << ", binding = 0) writeonly uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat)
		   << ", binding = 3) writeonly uniform " << TypePrefix<T>()
		   << "image2DArray g_image_2darray;" NL "layout(std430) buffer out_data {" NL "  ivec4 o_color;" NL "};" NL
			  "void main() {" NL "  "
		   << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>() << "vec4(o_color) + " << TypePrefix<T>() << "vec4"
		   << write_value
		   << ";" NL "  int g_index[6] = int[](o_color.x, o_color.y, o_color.z, o_color.w, o_color.r, o_color.g);";
		if (stage == 0)
		{ // VS
			os << NL "  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
		}
		os << NL "  imageStore(g_image_2d, coord, g_value);" NL
				 "  imageStore(g_image_3d, ivec3(coord.xy, g_index[0]), g_value);" NL
				 "  imageStore(g_image_3d, ivec3(coord.xy, g_index[1]), g_value);" NL
				 "  for (int i = 0; i < 6; ++i) {" NL
				 "    imageStore(g_image_cube, ivec3(coord, g_index[i]), g_value);" NL "  }" NL
				 "  imageStore(g_image_2darray, ivec3(coord, g_index[0]), g_value);" NL
				 "  imageStore(g_image_2darray, ivec3(coord, g_index[1]), g_value);" NL "}";
		return os.str();
	}